

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeaderBase.cpp
# Opt level: O0

char * __thiscall HttpHeaderBase::getField(HttpHeaderBase *this,FieldType type)

{
  int local_20;
  int i;
  FieldType type_local;
  HttpHeaderBase *this_local;
  
  local_20 = 0;
  while( true ) {
    if (this->mNumFields <= local_20) {
      return (char *)0x0;
    }
    if (this->mFields[local_20].mType == type) break;
    local_20 = local_20 + 1;
  }
  return this->mFields[local_20].mData;
}

Assistant:

const char *HttpHeaderBase::getField(FieldMap::FieldType type) const
{
	for (int i = 0; i < mNumFields; i++)
	{
		if (mFields[i].mType == type)
			return mFields[i].mData;
	}
	
	return NULL;
}